

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMulti.c
# Opt level: O3

Vec_Int_t * Gia_ManProcessOutputs(Vec_Ptr_t *vCexesIn,Vec_Ptr_t *vCexesOut,Vec_Int_t *vOutMap)

{
  void *pvVar1;
  uint uVar2;
  Vec_Int_t *pVVar3;
  int *__ptr;
  int iVar4;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  
  uVar7 = vCexesIn->nSize;
  if (uVar7 != vOutMap->nSize) {
    __assert_fail("Vec_PtrSize(vCexesIn) == Vec_IntSize(vOutMap)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMulti.c"
                  ,0x37,"Vec_Int_t *Gia_ManProcessOutputs(Vec_Ptr_t *, Vec_Ptr_t *, Vec_Int_t *)");
  }
  pVVar3 = (Vec_Int_t *)malloc(0x10);
  uVar2 = 0x10;
  if (0xe < uVar7 - 1) {
    uVar2 = uVar7;
  }
  pVVar3->nSize = 0;
  pVVar3->nCap = uVar2;
  iVar4 = 0;
  if (uVar2 == 0) {
    __ptr = (int *)0x0;
  }
  else {
    __ptr = (int *)malloc((long)(int)uVar2 << 2);
  }
  pVVar3->pArray = __ptr;
  if (0 < (int)uVar7) {
    lVar8 = 0;
    do {
      iVar4 = vOutMap->pArray[lVar8];
      lVar5 = (long)iVar4;
      if ((lVar5 < 0) || (vCexesOut->nSize <= iVar4)) {
LAB_005bd5d3:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      if (vCexesOut->pArray[lVar5] != (void *)0x0) {
        __assert_fail("Vec_PtrEntry(vCexesOut, iOut) == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMulti.c"
                      ,0x3b,
                      "Vec_Int_t *Gia_ManProcessOutputs(Vec_Ptr_t *, Vec_Ptr_t *, Vec_Int_t *)");
      }
      if (vCexesIn->nSize <= lVar8) goto LAB_005bd5d3;
      pvVar1 = vCexesIn->pArray[lVar8];
      if (pvVar1 == (void *)0x0) {
        uVar2 = pVVar3->nSize;
        uVar6 = (ulong)uVar2;
        if (((int)uVar2 < 0) || (uVar7 <= uVar2)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        vOutMap->pArray[uVar6] = iVar4;
        if (uVar2 == pVVar3->nCap) {
          if (uVar2 < 0x10) {
            if (__ptr == (int *)0x0) {
              __ptr = (int *)malloc(0x40);
            }
            else {
              __ptr = (int *)realloc(__ptr,0x40);
            }
            pVVar3->pArray = __ptr;
            iVar4 = 0x10;
            if (__ptr == (int *)0x0) {
LAB_005bd630:
              __assert_fail("p->pArray",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                            ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
            }
          }
          else {
            if (__ptr == (int *)0x0) {
              __ptr = (int *)malloc(uVar6 * 8);
            }
            else {
              __ptr = (int *)realloc(__ptr,uVar6 * 8);
            }
            pVVar3->pArray = __ptr;
            if (__ptr == (int *)0x0) goto LAB_005bd630;
            iVar4 = uVar2 * 2;
          }
          pVVar3->nCap = iVar4;
        }
        pVVar3->nSize = uVar2 + 1;
        __ptr[uVar6] = (int)lVar8;
        uVar7 = vOutMap->nSize;
      }
      else {
        vCexesIn->pArray[lVar8] = (void *)0x0;
        vCexesOut->pArray[lVar5] = pvVar1;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < (int)uVar7);
    iVar4 = pVVar3->nSize;
  }
  if ((int)uVar7 < iVar4) {
    __assert_fail("p->nSize >= nSizeNew",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x2b7,"void Vec_IntShrink(Vec_Int_t *, int)");
  }
  vOutMap->nSize = iVar4;
  return pVVar3;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Divides outputs into solved and unsolved.]

  Description [Return array of unsolved outputs to extract into a new AIG.
  Updates the resulting CEXes (vCexesOut) and current output map (vOutMap).]
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Vec_Int_t * Gia_ManProcessOutputs( Vec_Ptr_t * vCexesIn, Vec_Ptr_t * vCexesOut, Vec_Int_t * vOutMap )
{
    Abc_Cex_t * pCex; 
    Vec_Int_t * vLeftOver;
    int i, iOut;
    assert( Vec_PtrSize(vCexesIn) == Vec_IntSize(vOutMap) );
    vLeftOver = Vec_IntAlloc( Vec_PtrSize(vCexesIn) );
    Vec_IntForEachEntry( vOutMap, iOut, i )
    {
        assert( Vec_PtrEntry(vCexesOut, iOut) == NULL );
        pCex = (Abc_Cex_t *)Vec_PtrEntry( vCexesIn, i );
        if ( pCex ) // found a CEX for output iOut
        {
            Vec_PtrWriteEntry( vCexesIn, i, NULL );
            Vec_PtrWriteEntry( vCexesOut, iOut, pCex );
        }
        else // still unsolved
        {
            Vec_IntWriteEntry( vOutMap, Vec_IntSize(vLeftOver), iOut );
            Vec_IntPush( vLeftOver, i );
        }
    }
    Vec_IntShrink( vOutMap, Vec_IntSize(vLeftOver) );
    return vLeftOver;
}